

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimizer.cpp
# Opt level: O1

bool __thiscall
spvtools::Optimizer::RegisterPassFromFlag(Optimizer *this,string *flag,bool preserve_interface)

{
  _Head_base<0UL,_spvtools::Optimizer::Impl_*,_false> _Var1;
  bool bVar2;
  int iVar3;
  uint32_t size_limit;
  uint factor;
  long lVar4;
  MessageConsumer *consumer;
  function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)> *pfVar5;
  char *pcVar6;
  unordered_map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *puVar7;
  __integer_from_chars_result_type<unsigned_int> _Var8;
  string struct_name;
  string pass_name;
  string pass_args;
  uint32_t to_set;
  uint32_t from_set;
  string rule_name;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  p;
  spv_position_t local_108;
  _Head_base<0UL,_std::unordered_map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_*,_false>
  local_e8 [2];
  undefined1 local_d8 [16];
  _Head_base<0UL,_std::unordered_map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_*,_false>
  local_c8;
  ulong local_c0;
  undefined1 local_b8 [32];
  unordered_map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_98;
  undefined1 local_90 [40];
  IRContext *local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_50;
  __node_base local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  bVar2 = FlagHasValidForm(this,flag);
  if (!bVar2) {
    return false;
  }
  utils::SplitFlagArgs
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)(local_90 + 0x20),flag);
  local_e8[0]._M_head_impl =
       (unordered_map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        *)local_d8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_e8,local_90._32_8_,local_90._32_8_ + (long)&local_68->syntax_context_);
  local_c8._M_head_impl =
       (unordered_map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        *)local_b8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_c8,local_50,local_50->_M_local_buf + (long)&(local_48._M_nxt)->_M_nxt)
  ;
  iVar3 = std::__cxx11::string::compare((char *)local_e8);
  if (iVar3 == 0) {
    CreateStripDebugInfoPass();
LAB_00180c3c:
    RegisterPass(this,(PassToken *)&local_108);
    PassToken::~PassToken((PassToken *)&local_108);
  }
  else {
    iVar3 = std::__cxx11::string::compare((char *)local_e8);
    if ((iVar3 == 0) || (iVar3 = std::__cxx11::string::compare((char *)local_e8), iVar3 == 0)) {
      CreateStripNonSemanticInfoPass();
      goto LAB_00180c3c;
    }
    iVar3 = std::__cxx11::string::compare((char *)local_e8);
    if (iVar3 == 0) {
      CreateOpExtInstWithForwardReferenceFixupPass();
      goto LAB_00180c3c;
    }
    iVar3 = std::__cxx11::string::compare((char *)local_e8);
    if (iVar3 == 0) {
      if (local_c0 == 0) {
        consumer = &(((this->impl_)._M_t.
                      super___uniq_ptr_impl<spvtools::Optimizer::Impl,_std::default_delete<spvtools::Optimizer::Impl>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_spvtools::Optimizer::Impl_*,_std::default_delete<spvtools::Optimizer::Impl>_>
                      .super__Head_base<0UL,_spvtools::Optimizer::Impl_*,_false>._M_head_impl)->
                    pass_manager).consumer_;
        local_90._0_8_ = local_c8._M_head_impl;
        pcVar6 = 
        "Invalid spec constant value string \'%s\'. Expected a string of <spec id>:<default value> pairs."
        ;
        goto LAB_00180d7f;
      }
      opt::SetSpecConstantDefaultValuePass::ParseDefaultValuesString_abi_cxx11_
                ((SetSpecConstantDefaultValuePass *)local_90,(char *)local_c8._M_head_impl);
      puVar7 = (unordered_map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)local_90._0_8_;
      if ((unordered_map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *)local_90._0_8_ ==
          (unordered_map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *)0x0) {
        local_108.line = 0;
        local_108.column = 0;
        local_108.index = 0;
        local_98 = local_c8._M_head_impl;
        Logf<char_const*>(&(((this->impl_)._M_t.
                             super___uniq_ptr_impl<spvtools::Optimizer::Impl,_std::default_delete<spvtools::Optimizer::Impl>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_spvtools::Optimizer::Impl_*,_std::default_delete<spvtools::Optimizer::Impl>_>
                             .super__Head_base<0UL,_spvtools::Optimizer::Impl_*,_false>._M_head_impl
                            )->pass_manager).consumer_,SPV_MSG_ERROR,(char *)0x0,&local_108,
                          "Invalid argument for --set-spec-const-default-value: %s",
                          (char **)&local_98);
      }
      else {
        CreateSetSpecConstantDefaultValuePass
                  ((spvtools *)&local_108,
                   (unordered_map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)local_90._0_8_);
        RegisterPass(this,(PassToken *)&local_108);
        PassToken::~PassToken((PassToken *)&local_108);
      }
      std::
      unique_ptr<std::unordered_map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::default_delete<std::unordered_map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
      ::~unique_ptr((unique_ptr<std::unordered_map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::default_delete<std::unordered_map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                     *)local_90);
LAB_00180de6:
      if (puVar7 == (unordered_map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)0x0) goto LAB_00180def;
      goto LAB_00180c4f;
    }
    iVar3 = std::__cxx11::string::compare((char *)local_e8);
    if (iVar3 == 0) {
      CreateIfConversionPass();
      goto LAB_00180c3c;
    }
    iVar3 = std::__cxx11::string::compare((char *)local_e8);
    if (iVar3 == 0) {
      CreateFreezeSpecConstantValuePass();
      goto LAB_00180c3c;
    }
    iVar3 = std::__cxx11::string::compare((char *)local_e8);
    if (iVar3 == 0) {
      CreateInlineExhaustivePass();
      goto LAB_00180c3c;
    }
    iVar3 = std::__cxx11::string::compare((char *)local_e8);
    if (iVar3 == 0) {
      CreateInlineOpaquePass();
      goto LAB_00180c3c;
    }
    iVar3 = std::__cxx11::string::compare((char *)local_e8);
    if (iVar3 == 0) {
      CreateCombineAccessChainsPass();
      goto LAB_00180c3c;
    }
    iVar3 = std::__cxx11::string::compare((char *)local_e8);
    if (iVar3 == 0) {
      CreateLocalAccessChainConvertPass();
      goto LAB_00180c3c;
    }
    iVar3 = std::__cxx11::string::compare((char *)local_e8);
    if (iVar3 == 0) {
      CreateReplaceDescArrayAccessUsingVarIndexPass();
      goto LAB_00180c3c;
    }
    iVar3 = std::__cxx11::string::compare((char *)local_e8);
    if (iVar3 == 0) {
      CreateSpreadVolatileSemanticsPass();
      goto LAB_00180c3c;
    }
    iVar3 = std::__cxx11::string::compare((char *)local_e8);
    if (iVar3 == 0) {
      CreateDescriptorScalarReplacementPass();
      goto LAB_00180c3c;
    }
    iVar3 = std::__cxx11::string::compare((char *)local_e8);
    if (iVar3 == 0) {
      CreateDescriptorCompositeScalarReplacementPass();
      goto LAB_00180c3c;
    }
    iVar3 = std::__cxx11::string::compare((char *)local_e8);
    if (iVar3 == 0) {
      CreateDescriptorArrayScalarReplacementPass();
      goto LAB_00180c3c;
    }
    iVar3 = std::__cxx11::string::compare((char *)local_e8);
    if (iVar3 == 0) {
      CreateAggressiveDCEPass((spvtools *)&local_108,preserve_interface);
      goto LAB_00180c3c;
    }
    iVar3 = std::__cxx11::string::compare((char *)local_e8);
    if (iVar3 == 0) {
      CreateInsertExtractElimPass();
      goto LAB_00180c3c;
    }
    iVar3 = std::__cxx11::string::compare((char *)local_e8);
    if (iVar3 == 0) {
      CreateLocalSingleBlockLoadStoreElimPass();
      goto LAB_00180c3c;
    }
    iVar3 = std::__cxx11::string::compare((char *)local_e8);
    if (iVar3 == 0) {
      CreateLocalSingleStoreElimPass();
      goto LAB_00180c3c;
    }
    iVar3 = std::__cxx11::string::compare((char *)local_e8);
    if (iVar3 == 0) {
      CreateBlockMergePass();
      goto LAB_00180c3c;
    }
    iVar3 = std::__cxx11::string::compare((char *)local_e8);
    if (iVar3 == 0) {
      CreateMergeReturnPass();
      goto LAB_00180c3c;
    }
    iVar3 = std::__cxx11::string::compare((char *)local_e8);
    if (iVar3 == 0) {
      CreateDeadBranchElimPass();
      goto LAB_00180c3c;
    }
    iVar3 = std::__cxx11::string::compare((char *)local_e8);
    if (iVar3 == 0) {
      CreateEliminateDeadFunctionsPass();
      goto LAB_00180c3c;
    }
    iVar3 = std::__cxx11::string::compare((char *)local_e8);
    if (iVar3 == 0) {
      CreateLocalMultiStoreElimPass();
      goto LAB_00180c3c;
    }
    iVar3 = std::__cxx11::string::compare((char *)local_e8);
    if (iVar3 == 0) {
      CreateEliminateDeadConstantPass();
      goto LAB_00180c3c;
    }
    iVar3 = std::__cxx11::string::compare((char *)local_e8);
    if (iVar3 == 0) {
      CreateDeadInsertElimPass();
      goto LAB_00180c3c;
    }
    iVar3 = std::__cxx11::string::compare((char *)local_e8);
    if (iVar3 == 0) {
      CreateDeadVariableEliminationPass();
      goto LAB_00180c3c;
    }
    iVar3 = std::__cxx11::string::compare((char *)local_e8);
    if (iVar3 == 0) {
      CreateEliminateDeadMembersPass();
      goto LAB_00180c3c;
    }
    iVar3 = std::__cxx11::string::compare((char *)local_e8);
    if (iVar3 == 0) {
      CreateFoldSpecConstantOpAndCompositePass();
      goto LAB_00180c3c;
    }
    iVar3 = std::__cxx11::string::compare((char *)local_e8);
    if (iVar3 == 0) {
      CreateLoopUnswitchPass();
      goto LAB_00180c3c;
    }
    iVar3 = std::__cxx11::string::compare((char *)local_e8);
    if (iVar3 == 0) {
      if (local_c0 != 0) {
        lVar4 = std::__cxx11::string::find_first_not_of((char *)&local_c8,0x3242bd,0);
        size_limit = 0xffffffff;
        if (lVar4 == -1) {
          size_limit = atoi((char *)local_c8._M_head_impl);
        }
        if ((int)size_limit < 0) {
          _Var1._M_head_impl =
               (this->impl_)._M_t.
               super___uniq_ptr_impl<spvtools::Optimizer::Impl,_std::default_delete<spvtools::Optimizer::Impl>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::Optimizer::Impl_*,_std::default_delete<spvtools::Optimizer::Impl>_>
               .super__Head_base<0UL,_spvtools::Optimizer::Impl_*,_false>._M_head_impl;
          local_108.line = 0;
          local_108.column = 0;
          local_108.index = 0;
          if (*(_Manager_type *)((long)&(_Var1._M_head_impl)->pass_manager + 0x10) !=
              (_Manager_type)0x0) {
            std::
            function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>
            ::operator()(&((_Var1._M_head_impl)->pass_manager).consumer_,SPV_MSG_ERROR,(char *)0x0,
                         &local_108,
                         "--scalar-replacement must have no arguments or a non-negative integer argument"
                        );
          }
        }
        else {
          CreateScalarReplacementPass((spvtools *)&local_108,size_limit);
          RegisterPass(this,(PassToken *)&local_108);
          PassToken::~PassToken((PassToken *)&local_108);
        }
        if ((int)size_limit < 0) goto LAB_00180def;
        goto LAB_00180c4f;
      }
      CreateScalarReplacementPass((spvtools *)&local_108,100);
      goto LAB_00180c3c;
    }
    iVar3 = std::__cxx11::string::compare((char *)local_e8);
    if (iVar3 == 0) {
      CreateStrengthReductionPass();
      goto LAB_00180c3c;
    }
    iVar3 = std::__cxx11::string::compare((char *)local_e8);
    if (iVar3 == 0) {
      CreateUnifyConstantPass();
      goto LAB_00180c3c;
    }
    iVar3 = std::__cxx11::string::compare((char *)local_e8);
    if (iVar3 == 0) {
      CreateFlattenDecorationPass();
      goto LAB_00180c3c;
    }
    iVar3 = std::__cxx11::string::compare((char *)local_e8);
    if (iVar3 == 0) {
      CreateCompactIdsPass();
      goto LAB_00180c3c;
    }
    iVar3 = std::__cxx11::string::compare((char *)local_e8);
    if (iVar3 == 0) {
      CreateCFGCleanupPass();
      goto LAB_00180c3c;
    }
    iVar3 = std::__cxx11::string::compare((char *)local_e8);
    if (iVar3 == 0) {
      CreateLocalRedundancyEliminationPass();
      goto LAB_00180c3c;
    }
    iVar3 = std::__cxx11::string::compare((char *)local_e8);
    if (iVar3 == 0) {
      CreateLoopInvariantCodeMotionPass();
      goto LAB_00180c3c;
    }
    iVar3 = std::__cxx11::string::compare((char *)local_e8);
    if (iVar3 == 0) {
      if (local_c0 != 0) {
        lVar4 = std::__cxx11::string::find_first_not_of((char *)&local_c8,0x3242bc,0);
        if (lVar4 == -1) {
          local_b8._24_8_ = atof((char *)local_c8._M_head_impl);
        }
        else {
          local_b8._24_8_ = 0.9;
        }
        if ((double)local_b8._24_8_ < 0.0) {
          _Var1._M_head_impl =
               (this->impl_)._M_t.
               super___uniq_ptr_impl<spvtools::Optimizer::Impl,_std::default_delete<spvtools::Optimizer::Impl>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::Optimizer::Impl_*,_std::default_delete<spvtools::Optimizer::Impl>_>
               .super__Head_base<0UL,_spvtools::Optimizer::Impl_*,_false>._M_head_impl;
          local_108.line = 0;
          local_108.column = 0;
          local_108.index = 0;
          if (*(_Manager_type *)((long)&(_Var1._M_head_impl)->pass_manager + 0x10) !=
              (_Manager_type)0x0) {
            std::
            function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>
            ::operator()(&((_Var1._M_head_impl)->pass_manager).consumer_,SPV_MSG_ERROR,(char *)0x0,
                         &local_108,
                         "--reduce-load-size must have no arguments or a non-negative double argument"
                        );
          }
        }
        else {
          CreateReduceLoadSizePass((spvtools *)&local_108,(double)local_b8._24_8_);
          RegisterPass(this,(PassToken *)&local_108);
          PassToken::~PassToken((PassToken *)&local_108);
        }
        if ((double)local_b8._24_8_ < 0.0) goto LAB_00180def;
        goto LAB_00180c4f;
      }
      CreateReduceLoadSizePass((spvtools *)&local_108,0.9);
      goto LAB_00180c3c;
    }
    iVar3 = std::__cxx11::string::compare((char *)local_e8);
    if (iVar3 == 0) {
      CreateRedundancyEliminationPass();
      goto LAB_00180c3c;
    }
    iVar3 = std::__cxx11::string::compare((char *)local_e8);
    if (iVar3 == 0) {
      CreatePrivateToLocalPass();
      goto LAB_00180c3c;
    }
    iVar3 = std::__cxx11::string::compare((char *)local_e8);
    if (iVar3 == 0) {
      CreateRemoveDuplicatesPass();
      goto LAB_00180c3c;
    }
    iVar3 = std::__cxx11::string::compare((char *)local_e8);
    if (iVar3 == 0) {
      CreateWorkaround1209Pass();
      goto LAB_00180c3c;
    }
    iVar3 = std::__cxx11::string::compare((char *)local_e8);
    if (iVar3 == 0) {
      CreateReplaceInvalidOpcodePass();
      goto LAB_00180c3c;
    }
    iVar3 = std::__cxx11::string::compare((char *)local_e8);
    if (iVar3 == 0) {
      CreateConvertRelaxedToHalfPass();
      goto LAB_00180c3c;
    }
    iVar3 = std::__cxx11::string::compare((char *)local_e8);
    if (iVar3 == 0) {
      CreateRelaxFloatOpsPass();
      goto LAB_00180c3c;
    }
    iVar3 = std::__cxx11::string::compare((char *)local_e8);
    if (iVar3 == 0) {
      CreateInstDebugPrintfPass((spvtools *)&local_108,7,0x17);
      goto LAB_00180c3c;
    }
    iVar3 = std::__cxx11::string::compare((char *)local_e8);
    if (iVar3 == 0) {
      CreateSimplificationPass();
      goto LAB_00180c3c;
    }
    iVar3 = std::__cxx11::string::compare((char *)local_e8);
    if (iVar3 == 0) {
      CreateSSARewritePass();
      goto LAB_00180c3c;
    }
    iVar3 = std::__cxx11::string::compare((char *)local_e8);
    if (iVar3 == 0) {
      CreateCopyPropagateArraysPass();
      goto LAB_00180c3c;
    }
    iVar3 = std::__cxx11::string::compare((char *)local_e8);
    if (iVar3 == 0) {
      if (local_c0 == 0) {
        factor = 0xffffffff;
      }
      else {
        factor = atoi((char *)local_c8._M_head_impl);
      }
      if ((int)factor < 1) {
        _Var1._M_head_impl =
             (this->impl_)._M_t.
             super___uniq_ptr_impl<spvtools::Optimizer::Impl,_std::default_delete<spvtools::Optimizer::Impl>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::Optimizer::Impl_*,_std::default_delete<spvtools::Optimizer::Impl>_>
             .super__Head_base<0UL,_spvtools::Optimizer::Impl_*,_false>._M_head_impl;
        local_108.line = 0;
        local_108.column = 0;
        local_108.index = 0;
        if (*(_Manager_type *)((long)&(_Var1._M_head_impl)->pass_manager + 0x10) !=
            (_Manager_type)0x0) {
          pfVar5 = &((_Var1._M_head_impl)->pass_manager).consumer_;
          pcVar6 = "--loop-fission must have a positive integer argument";
LAB_0018130c:
          local_108.index = 0;
          local_108.column = 0;
          local_108.line = 0;
          std::
          function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>::
          operator()(pfVar5,SPV_MSG_ERROR,(char *)0x0,&local_108,pcVar6);
        }
      }
      else {
        CreateLoopFissionPass((spvtools *)&local_108,(ulong)factor);
LAB_001812d0:
        RegisterPass(this,(PassToken *)&local_108);
        PassToken::~PassToken((PassToken *)&local_108);
      }
LAB_0018131b:
      if ((int)factor < 1) {
LAB_00180def:
        bVar2 = false;
        goto LAB_00180c51;
      }
    }
    else {
      iVar3 = std::__cxx11::string::compare((char *)local_e8);
      if (iVar3 == 0) {
        if (local_c0 == 0) {
          factor = 0xffffffff;
        }
        else {
          factor = atoi((char *)local_c8._M_head_impl);
        }
        if (0 < (int)factor) {
          CreateLoopFusionPass((spvtools *)&local_108,(ulong)factor);
          goto LAB_001812d0;
        }
        _Var1._M_head_impl =
             (this->impl_)._M_t.
             super___uniq_ptr_impl<spvtools::Optimizer::Impl,_std::default_delete<spvtools::Optimizer::Impl>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::Optimizer::Impl_*,_std::default_delete<spvtools::Optimizer::Impl>_>
             .super__Head_base<0UL,_spvtools::Optimizer::Impl_*,_false>._M_head_impl;
        local_108.line = 0;
        local_108.column = 0;
        local_108.index = 0;
        if (*(_Manager_type *)((long)&(_Var1._M_head_impl)->pass_manager + 0x10) !=
            (_Manager_type)0x0) {
          pfVar5 = &((_Var1._M_head_impl)->pass_manager).consumer_;
          pcVar6 = "--loop-fusion must have a positive integer argument";
          goto LAB_0018130c;
        }
        goto LAB_0018131b;
      }
      iVar3 = std::__cxx11::string::compare((char *)local_e8);
      if (iVar3 == 0) {
        CreateLoopUnrollPass((spvtools *)&local_108,true,0);
        goto LAB_00180c3c;
      }
      iVar3 = std::__cxx11::string::compare((char *)local_e8);
      if (iVar3 == 0) {
        CreateUpgradeMemoryModelPass();
        goto LAB_00180c3c;
      }
      iVar3 = std::__cxx11::string::compare((char *)local_e8);
      if (iVar3 == 0) {
        CreateVectorDCEPass();
        goto LAB_00180c3c;
      }
      iVar3 = std::__cxx11::string::compare((char *)local_e8);
      if (iVar3 == 0) {
        if (local_c0 == 0) {
          factor = 0;
        }
        else {
          factor = atoi((char *)local_c8._M_head_impl);
        }
        if (0 < (int)factor) {
          CreateLoopUnrollPass((spvtools *)&local_108,false,factor);
          goto LAB_001812d0;
        }
        _Var1._M_head_impl =
             (this->impl_)._M_t.
             super___uniq_ptr_impl<spvtools::Optimizer::Impl,_std::default_delete<spvtools::Optimizer::Impl>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::Optimizer::Impl_*,_std::default_delete<spvtools::Optimizer::Impl>_>
             .super__Head_base<0UL,_spvtools::Optimizer::Impl_*,_false>._M_head_impl;
        local_108.line = 0;
        local_108.column = 0;
        local_108.index = 0;
        if (*(_Manager_type *)((long)&(_Var1._M_head_impl)->pass_manager + 0x10) !=
            (_Manager_type)0x0) {
          pfVar5 = &((_Var1._M_head_impl)->pass_manager).consumer_;
          pcVar6 = "--loop-unroll-partial must have a positive integer argument";
          goto LAB_0018130c;
        }
        goto LAB_0018131b;
      }
      iVar3 = std::__cxx11::string::compare((char *)local_e8);
      if (iVar3 == 0) {
        CreateLoopPeelingPass();
        goto LAB_00180c3c;
      }
      iVar3 = std::__cxx11::string::compare((char *)local_e8);
      if (iVar3 == 0) {
        if (local_c0 == 0) {
          factor = 0;
        }
        else {
          factor = atoi((char *)local_c8._M_head_impl);
        }
        if ((int)factor < 1) {
          _Var1._M_head_impl =
               (this->impl_)._M_t.
               super___uniq_ptr_impl<spvtools::Optimizer::Impl,_std::default_delete<spvtools::Optimizer::Impl>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::Optimizer::Impl_*,_std::default_delete<spvtools::Optimizer::Impl>_>
               .super__Head_base<0UL,_spvtools::Optimizer::Impl_*,_false>._M_head_impl;
          local_108.line = 0;
          local_108.column = 0;
          local_108.index = 0;
          if (*(_Manager_type *)((long)&(_Var1._M_head_impl)->pass_manager + 0x10) !=
              (_Manager_type)0x0) {
            pfVar5 = &((_Var1._M_head_impl)->pass_manager).consumer_;
            pcVar6 = "--loop-peeling-threshold must have a positive integer argument";
            goto LAB_0018130c;
          }
        }
        else {
          opt::LoopPeelingPass::code_grow_threshold_ = (ulong)factor;
        }
        goto LAB_0018131b;
      }
      iVar3 = std::__cxx11::string::compare((char *)local_e8);
      if (iVar3 == 0) {
        CreateCCPPass();
        goto LAB_00180c3c;
      }
      iVar3 = std::__cxx11::string::compare((char *)local_e8);
      if (iVar3 == 0) {
        CreateCodeSinkingPass();
        goto LAB_00180c3c;
      }
      iVar3 = std::__cxx11::string::compare((char *)local_e8);
      if (iVar3 == 0) {
        CreateFixStorageClassPass();
        goto LAB_00180c3c;
      }
      iVar3 = std::__cxx11::string::compare((char *)local_e8);
      if (iVar3 != 0) {
        iVar3 = std::__cxx11::string::compare((char *)local_e8);
        if (iVar3 == 0) {
          RegisterSizePasses(this,preserve_interface);
          goto LAB_00180c4f;
        }
        iVar3 = std::__cxx11::string::compare((char *)local_e8);
        if (iVar3 == 0) {
          RegisterLegalizationPasses(this,preserve_interface);
          goto LAB_00180c4f;
        }
        iVar3 = std::__cxx11::string::compare((char *)local_e8);
        if (iVar3 == 0) {
          CreateRemoveUnusedInterfaceVariablesPass();
          goto LAB_00180c3c;
        }
        iVar3 = std::__cxx11::string::compare((char *)local_e8);
        if (iVar3 == 0) {
          CreateGraphicsRobustAccessPass();
          goto LAB_00180c3c;
        }
        iVar3 = std::__cxx11::string::compare((char *)local_e8);
        if (iVar3 == 0) {
          CreateWrapOpKillPass();
          goto LAB_00180c3c;
        }
        iVar3 = std::__cxx11::string::compare((char *)local_e8);
        if (iVar3 == 0) {
          CreateAmdExtToKhrPass();
          goto LAB_00180c3c;
        }
        iVar3 = std::__cxx11::string::compare((char *)local_e8);
        if (iVar3 == 0) {
          CreateInterpolateFixupPass();
          goto LAB_00180c3c;
        }
        iVar3 = std::__cxx11::string::compare((char *)local_e8);
        if (iVar3 == 0) {
          CreateRemoveDontInlinePass();
          goto LAB_00180c3c;
        }
        iVar3 = std::__cxx11::string::compare((char *)local_e8);
        if (iVar3 == 0) {
          CreateEliminateDeadInputComponentsSafePass();
          goto LAB_00180c3c;
        }
        iVar3 = std::__cxx11::string::compare((char *)local_e8);
        if (iVar3 == 0) {
          CreateFixFuncCallArgumentsPass();
          goto LAB_00180c3c;
        }
        iVar3 = std::__cxx11::string::compare((char *)local_e8);
        if (iVar3 == 0) {
          if (local_c0 != 0) {
            opt::ConvertToSampledImagePass::ParseDescriptorSetBindingPairsString
                      ((ConvertToSampledImagePass *)local_90,(char *)local_c8._M_head_impl);
            puVar7 = (unordered_map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)local_90._0_8_;
            if ((unordered_map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)local_90._0_8_ ==
                (unordered_map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)0x0) {
              local_108.line = 0;
              local_108.column = 0;
              local_108.index = 0;
              local_98 = local_c8._M_head_impl;
              Logf<char_const*>(&(((this->impl_)._M_t.
                                   super___uniq_ptr_impl<spvtools::Optimizer::Impl,_std::default_delete<spvtools::Optimizer::Impl>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_spvtools::Optimizer::Impl_*,_std::default_delete<spvtools::Optimizer::Impl>_>
                                   .super__Head_base<0UL,_spvtools::Optimizer::Impl_*,_false>.
                                  _M_head_impl)->pass_manager).consumer_,SPV_MSG_ERROR,(char *)0x0,
                                &local_108,"Invalid argument for --convert-to-sampled-image: %s",
                                (char **)&local_98);
            }
            else {
              CreateConvertToSampledImagePass
                        ((spvtools *)&local_108,
                         (vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>
                          *)local_90._0_8_);
              RegisterPass(this,(PassToken *)&local_108);
              PassToken::~PassToken((PassToken *)&local_108);
            }
            if ((unordered_map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)local_90._0_8_ !=
                (unordered_map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)0x0) {
              std::
              default_delete<std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>_>
              ::operator()((default_delete<std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>_>
                            *)local_90,
                           (vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>
                            *)local_90._0_8_);
            }
            goto LAB_00180de6;
          }
          consumer = &(((this->impl_)._M_t.
                        super___uniq_ptr_impl<spvtools::Optimizer::Impl,_std::default_delete<spvtools::Optimizer::Impl>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_spvtools::Optimizer::Impl_*,_std::default_delete<spvtools::Optimizer::Impl>_>
                        .super__Head_base<0UL,_spvtools::Optimizer::Impl_*,_false>._M_head_impl)->
                      pass_manager).consumer_;
          local_90._0_8_ = local_c8._M_head_impl;
          pcVar6 = 
          "Invalid pairs of descriptor set and binding \'%s\'. Expected a string of <descriptor set>:<binding> pairs."
          ;
LAB_00180d7f:
          local_108.index = 0;
          local_108.column = 0;
          local_108.line = 0;
          bVar2 = false;
          Logf<char_const*>(consumer,SPV_MSG_ERROR,(char *)0x0,&local_108,pcVar6,(char **)local_90);
          goto LAB_00180c51;
        }
        iVar3 = std::__cxx11::string::compare((char *)local_e8);
        if (iVar3 == 0) {
          if (local_c0 != 0) {
            lVar4 = std::__cxx11::string::find((char)&local_c8,0x3a);
            if ((1 < lVar4 + 1U) && (lVar4 + 1U != local_c0)) {
              std::__cxx11::string::substr((ulong)&local_108,(ulong)&local_c8);
              std::__cxx11::string::substr((ulong)local_90,(ulong)&local_c8);
              CreateStructPackingPass
                        ((spvtools *)&local_98,(char *)local_108.line,(char *)local_90._0_8_);
              RegisterPass(this,(PassToken *)&local_98);
              PassToken::~PassToken((PassToken *)&local_98);
              if ((unordered_map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)local_90._0_8_ !=
                  (unordered_map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)(local_90 + 0x10)) {
                operator_delete((void *)local_90._0_8_,local_90._16_8_ + 1);
              }
              if ((size_t *)local_108.line != &local_108.index) {
                operator_delete((void *)local_108.line,local_108.index + 1);
              }
              goto LAB_00180c4f;
            }
            consumer = &(((this->impl_)._M_t.
                          super___uniq_ptr_impl<spvtools::Optimizer::Impl,_std::default_delete<spvtools::Optimizer::Impl>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_spvtools::Optimizer::Impl_*,_std::default_delete<spvtools::Optimizer::Impl>_>
                          .super__Head_base<0UL,_spvtools::Optimizer::Impl_*,_false>._M_head_impl)->
                        pass_manager).consumer_;
            local_90._0_8_ = local_c8._M_head_impl;
            pcVar6 = "Invalid argument for --struct-packing: %s";
            goto LAB_00180d7f;
          }
          _Var1._M_head_impl =
               (this->impl_)._M_t.
               super___uniq_ptr_impl<spvtools::Optimizer::Impl,_std::default_delete<spvtools::Optimizer::Impl>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::Optimizer::Impl_*,_std::default_delete<spvtools::Optimizer::Impl>_>
               .super__Head_base<0UL,_spvtools::Optimizer::Impl_*,_false>._M_head_impl;
          local_108.line = 0;
          local_108.column = 0;
          local_108.index = 0;
          if (*(_Manager_type *)((long)&(_Var1._M_head_impl)->pass_manager + 0x10) !=
              (_Manager_type)0x0) {
            pfVar5 = &((_Var1._M_head_impl)->pass_manager).consumer_;
            pcVar6 = "--struct-packing requires a name:rule argument.";
LAB_00181895:
            local_108.index = 0;
            local_108.column = 0;
            local_108.line = 0;
            std::
            function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>
            ::operator()(pfVar5,SPV_MSG_ERROR,(char *)0x0,&local_108,pcVar6);
          }
        }
        else {
          iVar3 = std::__cxx11::string::compare((char *)local_e8);
          if (iVar3 != 0) {
            iVar3 = std::__cxx11::string::compare((char *)local_e8);
            if (iVar3 == 0) {
              if (local_c0 == 0) {
                _Var1._M_head_impl =
                     (this->impl_)._M_t.
                     super___uniq_ptr_impl<spvtools::Optimizer::Impl,_std::default_delete<spvtools::Optimizer::Impl>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_spvtools::Optimizer::Impl_*,_std::default_delete<spvtools::Optimizer::Impl>_>
                     .super__Head_base<0UL,_spvtools::Optimizer::Impl_*,_false>._M_head_impl;
                local_108.line = 0;
                local_108.column = 0;
                local_108.index = 0;
                if (*(_Manager_type *)((long)&(_Var1._M_head_impl)->pass_manager + 0x10) !=
                    (_Manager_type)0x0) {
                  pfVar5 = &((_Var1._M_head_impl)->pass_manager).consumer_;
                  pcVar6 = "--modify-maximal-reconvergence requires an argument";
                  goto LAB_00181895;
                }
                goto LAB_00180def;
              }
              iVar3 = std::__cxx11::string::compare((char *)&local_c8);
              if (iVar3 == 0) {
                bVar2 = true;
              }
              else {
                iVar3 = std::__cxx11::string::compare((char *)&local_c8);
                if (iVar3 != 0) {
                  consumer = &(((this->impl_)._M_t.
                                super___uniq_ptr_impl<spvtools::Optimizer::Impl,_std::default_delete<spvtools::Optimizer::Impl>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_spvtools::Optimizer::Impl_*,_std::default_delete<spvtools::Optimizer::Impl>_>
                                .super__Head_base<0UL,_spvtools::Optimizer::Impl_*,_false>.
                               _M_head_impl)->pass_manager).consumer_;
                  local_90._0_8_ = local_c8._M_head_impl;
                  pcVar6 = 
                  "Invalid argument for --modify-maximal-reconvergence: %s (must be \'add\' or \'remove\')"
                  ;
                  goto LAB_00180d7f;
                }
                bVar2 = false;
              }
              CreateModifyMaximalReconvergencePass((spvtools *)&local_108,bVar2);
            }
            else {
              iVar3 = std::__cxx11::string::compare((char *)local_e8);
              if (iVar3 != 0) {
                consumer = &(((this->impl_)._M_t.
                              super___uniq_ptr_impl<spvtools::Optimizer::Impl,_std::default_delete<spvtools::Optimizer::Impl>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_spvtools::Optimizer::Impl_*,_std::default_delete<spvtools::Optimizer::Impl>_>
                              .super__Head_base<0UL,_spvtools::Optimizer::Impl_*,_false>.
                             _M_head_impl)->pass_manager).consumer_;
                local_90._0_8_ = local_e8[0]._M_head_impl;
                pcVar6 = "Unknown flag \'--%s\'. Use --help for a list of valid flags";
                goto LAB_00180d7f;
              }
              CreateTrimCapabilitiesPass();
            }
            goto LAB_00180c3c;
          }
          if (local_c0 == 0) {
            _Var1._M_head_impl =
                 (this->impl_)._M_t.
                 super___uniq_ptr_impl<spvtools::Optimizer::Impl,_std::default_delete<spvtools::Optimizer::Impl>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_spvtools::Optimizer::Impl_*,_std::default_delete<spvtools::Optimizer::Impl>_>
                 .super__Head_base<0UL,_spvtools::Optimizer::Impl_*,_false>._M_head_impl;
            local_108.line = 0;
            local_108.column = 0;
            local_108.index = 0;
            if (*(_Manager_type *)((long)&(_Var1._M_head_impl)->pass_manager + 0x10) !=
                (_Manager_type)0x0) {
              pfVar5 = &((_Var1._M_head_impl)->pass_manager).consumer_;
              pcVar6 = "--switch-descriptorset requires a from:to argument.";
              goto LAB_00181895;
            }
          }
          else {
            local_98 = (unordered_map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)((ulong)local_98 & 0xffffffff00000000);
            local_b8._20_4_ = 0;
            pcVar6 = (char *)((long)&((local_c8._M_head_impl)->_M_h)._M_buckets + local_c0);
            _Var8 = std::from_chars<unsigned_int>
                              ((char *)local_c8._M_head_impl,pcVar6,(uint *)&local_98,10);
            if (((_Var8.ec == 0) && (*_Var8.ptr == ':')) &&
               (_Var8 = std::from_chars<unsigned_int>
                                  (_Var8.ptr + 1,pcVar6,(uint *)(local_b8 + 0x14),10),
               _Var8.ec == 0 && _Var8.ptr == pcVar6)) {
              CreateSwitchDescriptorSetPass
                        ((spvtools *)&local_108,(uint32_t)local_98._0_4_,local_b8._20_4_);
              goto LAB_00180c3c;
            }
            local_108.line = 0;
            local_108.column = 0;
            local_108.index = 0;
            local_90._0_8_ = local_c8._M_head_impl;
            Logf<char_const*>(&(((this->impl_)._M_t.
                                 super___uniq_ptr_impl<spvtools::Optimizer::Impl,_std::default_delete<spvtools::Optimizer::Impl>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_spvtools::Optimizer::Impl_*,_std::default_delete<spvtools::Optimizer::Impl>_>
                                 .super__Head_base<0UL,_spvtools::Optimizer::Impl_*,_false>.
                                _M_head_impl)->pass_manager).consumer_,SPV_MSG_ERROR,(char *)0x0,
                              &local_108,"Invalid argument for --switch-descriptorset: %s",
                              (char **)local_90);
          }
        }
        goto LAB_00180def;
      }
      RegisterPerformancePasses(this,preserve_interface);
    }
  }
LAB_00180c4f:
  bVar2 = true;
LAB_00180c51:
  if (local_c8._M_head_impl !=
      (unordered_map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       *)local_b8) {
    operator_delete(local_c8._M_head_impl,local_b8._0_8_ + 1);
  }
  if (local_e8[0]._M_head_impl !=
      (unordered_map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       *)local_d8) {
    operator_delete(local_e8[0]._M_head_impl,local_d8._0_8_ + 1);
  }
  if (local_50 != &local_40) {
    operator_delete(local_50,local_40._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._32_8_ != &local_60) {
    operator_delete((void *)local_90._32_8_,local_60._M_allocated_capacity + 1);
  }
  return bVar2;
}

Assistant:

bool Optimizer::RegisterPassFromFlag(const std::string& flag,
                                     bool preserve_interface) {
  if (!FlagHasValidForm(flag)) {
    return false;
  }

  // Split flags of the form --pass_name=pass_args.
  auto p = utils::SplitFlagArgs(flag);
  std::string pass_name = p.first;
  std::string pass_args = p.second;

  // FIXME(dnovillo): This should be re-factored so that pass names can be
  // automatically checked against Pass::name() and PassToken instances created
  // via a template function.  Additionally, class Pass should have a desc()
  // method that describes the pass (so it can be used in --help).
  //
  // Both Pass::name() and Pass::desc() should be static class members so they
  // can be invoked without creating a pass instance.
  if (pass_name == "strip-debug") {
    RegisterPass(CreateStripDebugInfoPass());
  } else if (pass_name == "strip-reflect") {
    RegisterPass(CreateStripReflectInfoPass());
  } else if (pass_name == "strip-nonsemantic") {
    RegisterPass(CreateStripNonSemanticInfoPass());
  } else if (pass_name == "fix-opextinst-opcodes") {
    RegisterPass(CreateOpExtInstWithForwardReferenceFixupPass());
  } else if (pass_name == "set-spec-const-default-value") {
    if (pass_args.size() > 0) {
      auto spec_ids_vals =
          opt::SetSpecConstantDefaultValuePass::ParseDefaultValuesString(
              pass_args.c_str());
      if (!spec_ids_vals) {
        Errorf(consumer(), nullptr, {},
               "Invalid argument for --set-spec-const-default-value: %s",
               pass_args.c_str());
        return false;
      }
      RegisterPass(
          CreateSetSpecConstantDefaultValuePass(std::move(*spec_ids_vals)));
    } else {
      Errorf(consumer(), nullptr, {},
             "Invalid spec constant value string '%s'. Expected a string of "
             "<spec id>:<default value> pairs.",
             pass_args.c_str());
      return false;
    }
  } else if (pass_name == "if-conversion") {
    RegisterPass(CreateIfConversionPass());
  } else if (pass_name == "freeze-spec-const") {
    RegisterPass(CreateFreezeSpecConstantValuePass());
  } else if (pass_name == "inline-entry-points-exhaustive") {
    RegisterPass(CreateInlineExhaustivePass());
  } else if (pass_name == "inline-entry-points-opaque") {
    RegisterPass(CreateInlineOpaquePass());
  } else if (pass_name == "combine-access-chains") {
    RegisterPass(CreateCombineAccessChainsPass());
  } else if (pass_name == "convert-local-access-chains") {
    RegisterPass(CreateLocalAccessChainConvertPass());
  } else if (pass_name == "replace-desc-array-access-using-var-index") {
    RegisterPass(CreateReplaceDescArrayAccessUsingVarIndexPass());
  } else if (pass_name == "spread-volatile-semantics") {
    RegisterPass(CreateSpreadVolatileSemanticsPass());
  } else if (pass_name == "descriptor-scalar-replacement") {
    RegisterPass(CreateDescriptorScalarReplacementPass());
  } else if (pass_name == "descriptor-composite-scalar-replacement") {
    RegisterPass(CreateDescriptorCompositeScalarReplacementPass());
  } else if (pass_name == "descriptor-array-scalar-replacement") {
    RegisterPass(CreateDescriptorArrayScalarReplacementPass());
  } else if (pass_name == "eliminate-dead-code-aggressive") {
    RegisterPass(CreateAggressiveDCEPass(preserve_interface));
  } else if (pass_name == "eliminate-insert-extract") {
    RegisterPass(CreateInsertExtractElimPass());
  } else if (pass_name == "eliminate-local-single-block") {
    RegisterPass(CreateLocalSingleBlockLoadStoreElimPass());
  } else if (pass_name == "eliminate-local-single-store") {
    RegisterPass(CreateLocalSingleStoreElimPass());
  } else if (pass_name == "merge-blocks") {
    RegisterPass(CreateBlockMergePass());
  } else if (pass_name == "merge-return") {
    RegisterPass(CreateMergeReturnPass());
  } else if (pass_name == "eliminate-dead-branches") {
    RegisterPass(CreateDeadBranchElimPass());
  } else if (pass_name == "eliminate-dead-functions") {
    RegisterPass(CreateEliminateDeadFunctionsPass());
  } else if (pass_name == "eliminate-local-multi-store") {
    RegisterPass(CreateLocalMultiStoreElimPass());
  } else if (pass_name == "eliminate-dead-const") {
    RegisterPass(CreateEliminateDeadConstantPass());
  } else if (pass_name == "eliminate-dead-inserts") {
    RegisterPass(CreateDeadInsertElimPass());
  } else if (pass_name == "eliminate-dead-variables") {
    RegisterPass(CreateDeadVariableEliminationPass());
  } else if (pass_name == "eliminate-dead-members") {
    RegisterPass(CreateEliminateDeadMembersPass());
  } else if (pass_name == "fold-spec-const-op-composite") {
    RegisterPass(CreateFoldSpecConstantOpAndCompositePass());
  } else if (pass_name == "loop-unswitch") {
    RegisterPass(CreateLoopUnswitchPass());
  } else if (pass_name == "scalar-replacement") {
    if (pass_args.size() == 0) {
      RegisterPass(CreateScalarReplacementPass());
    } else {
      int limit = -1;
      if (pass_args.find_first_not_of("0123456789") == std::string::npos) {
        limit = atoi(pass_args.c_str());
      }

      if (limit >= 0) {
        RegisterPass(CreateScalarReplacementPass(limit));
      } else {
        Error(consumer(), nullptr, {},
              "--scalar-replacement must have no arguments or a non-negative "
              "integer argument");
        return false;
      }
    }
  } else if (pass_name == "strength-reduction") {
    RegisterPass(CreateStrengthReductionPass());
  } else if (pass_name == "unify-const") {
    RegisterPass(CreateUnifyConstantPass());
  } else if (pass_name == "flatten-decorations") {
    RegisterPass(CreateFlattenDecorationPass());
  } else if (pass_name == "compact-ids") {
    RegisterPass(CreateCompactIdsPass());
  } else if (pass_name == "cfg-cleanup") {
    RegisterPass(CreateCFGCleanupPass());
  } else if (pass_name == "local-redundancy-elimination") {
    RegisterPass(CreateLocalRedundancyEliminationPass());
  } else if (pass_name == "loop-invariant-code-motion") {
    RegisterPass(CreateLoopInvariantCodeMotionPass());
  } else if (pass_name == "reduce-load-size") {
    if (pass_args.size() == 0) {
      RegisterPass(CreateReduceLoadSizePass());
    } else {
      double load_replacement_threshold = 0.9;
      if (pass_args.find_first_not_of(".0123456789") == std::string::npos) {
        load_replacement_threshold = atof(pass_args.c_str());
      }

      if (load_replacement_threshold >= 0) {
        RegisterPass(CreateReduceLoadSizePass(load_replacement_threshold));
      } else {
        Error(consumer(), nullptr, {},
              "--reduce-load-size must have no arguments or a non-negative "
              "double argument");
        return false;
      }
    }
  } else if (pass_name == "redundancy-elimination") {
    RegisterPass(CreateRedundancyEliminationPass());
  } else if (pass_name == "private-to-local") {
    RegisterPass(CreatePrivateToLocalPass());
  } else if (pass_name == "remove-duplicates") {
    RegisterPass(CreateRemoveDuplicatesPass());
  } else if (pass_name == "workaround-1209") {
    RegisterPass(CreateWorkaround1209Pass());
  } else if (pass_name == "replace-invalid-opcode") {
    RegisterPass(CreateReplaceInvalidOpcodePass());
  } else if (pass_name == "convert-relaxed-to-half") {
    RegisterPass(CreateConvertRelaxedToHalfPass());
  } else if (pass_name == "relax-float-ops") {
    RegisterPass(CreateRelaxFloatOpsPass());
  } else if (pass_name == "inst-debug-printf") {
    // This private option is not for user consumption.
    // It is here to assist in debugging and fixing the debug printf
    // instrumentation pass.
    // For users who wish to utilize debug printf, see the white paper at
    // https://www.lunarg.com/wp-content/uploads/2021/08/Using-Debug-Printf-02August2021.pdf
    RegisterPass(CreateInstDebugPrintfPass(7, 23));
  } else if (pass_name == "simplify-instructions") {
    RegisterPass(CreateSimplificationPass());
  } else if (pass_name == "ssa-rewrite") {
    RegisterPass(CreateSSARewritePass());
  } else if (pass_name == "copy-propagate-arrays") {
    RegisterPass(CreateCopyPropagateArraysPass());
  } else if (pass_name == "loop-fission") {
    int register_threshold_to_split =
        (pass_args.size() > 0) ? atoi(pass_args.c_str()) : -1;
    if (register_threshold_to_split > 0) {
      RegisterPass(CreateLoopFissionPass(
          static_cast<size_t>(register_threshold_to_split)));
    } else {
      Error(consumer(), nullptr, {},
            "--loop-fission must have a positive integer argument");
      return false;
    }
  } else if (pass_name == "loop-fusion") {
    int max_registers_per_loop =
        (pass_args.size() > 0) ? atoi(pass_args.c_str()) : -1;
    if (max_registers_per_loop > 0) {
      RegisterPass(
          CreateLoopFusionPass(static_cast<size_t>(max_registers_per_loop)));
    } else {
      Error(consumer(), nullptr, {},
            "--loop-fusion must have a positive integer argument");
      return false;
    }
  } else if (pass_name == "loop-unroll") {
    RegisterPass(CreateLoopUnrollPass(true));
  } else if (pass_name == "upgrade-memory-model") {
    RegisterPass(CreateUpgradeMemoryModelPass());
  } else if (pass_name == "vector-dce") {
    RegisterPass(CreateVectorDCEPass());
  } else if (pass_name == "loop-unroll-partial") {
    int factor = (pass_args.size() > 0) ? atoi(pass_args.c_str()) : 0;
    if (factor > 0) {
      RegisterPass(CreateLoopUnrollPass(false, factor));
    } else {
      Error(consumer(), nullptr, {},
            "--loop-unroll-partial must have a positive integer argument");
      return false;
    }
  } else if (pass_name == "loop-peeling") {
    RegisterPass(CreateLoopPeelingPass());
  } else if (pass_name == "loop-peeling-threshold") {
    int factor = (pass_args.size() > 0) ? atoi(pass_args.c_str()) : 0;
    if (factor > 0) {
      opt::LoopPeelingPass::SetLoopPeelingThreshold(factor);
    } else {
      Error(consumer(), nullptr, {},
            "--loop-peeling-threshold must have a positive integer argument");
      return false;
    }
  } else if (pass_name == "ccp") {
    RegisterPass(CreateCCPPass());
  } else if (pass_name == "code-sink") {
    RegisterPass(CreateCodeSinkingPass());
  } else if (pass_name == "fix-storage-class") {
    RegisterPass(CreateFixStorageClassPass());
  } else if (pass_name == "O") {
    RegisterPerformancePasses(preserve_interface);
  } else if (pass_name == "Os") {
    RegisterSizePasses(preserve_interface);
  } else if (pass_name == "legalize-hlsl") {
    RegisterLegalizationPasses(preserve_interface);
  } else if (pass_name == "remove-unused-interface-variables") {
    RegisterPass(CreateRemoveUnusedInterfaceVariablesPass());
  } else if (pass_name == "graphics-robust-access") {
    RegisterPass(CreateGraphicsRobustAccessPass());
  } else if (pass_name == "wrap-opkill") {
    RegisterPass(CreateWrapOpKillPass());
  } else if (pass_name == "amd-ext-to-khr") {
    RegisterPass(CreateAmdExtToKhrPass());
  } else if (pass_name == "interpolate-fixup") {
    RegisterPass(CreateInterpolateFixupPass());
  } else if (pass_name == "remove-dont-inline") {
    RegisterPass(CreateRemoveDontInlinePass());
  } else if (pass_name == "eliminate-dead-input-components") {
    RegisterPass(CreateEliminateDeadInputComponentsSafePass());
  } else if (pass_name == "fix-func-call-param") {
    RegisterPass(CreateFixFuncCallArgumentsPass());
  } else if (pass_name == "convert-to-sampled-image") {
    if (pass_args.size() > 0) {
      auto descriptor_set_binding_pairs =
          opt::ConvertToSampledImagePass::ParseDescriptorSetBindingPairsString(
              pass_args.c_str());
      if (!descriptor_set_binding_pairs) {
        Errorf(consumer(), nullptr, {},
               "Invalid argument for --convert-to-sampled-image: %s",
               pass_args.c_str());
        return false;
      }
      RegisterPass(CreateConvertToSampledImagePass(
          std::move(*descriptor_set_binding_pairs)));
    } else {
      Errorf(consumer(), nullptr, {},
             "Invalid pairs of descriptor set and binding '%s'. Expected a "
             "string of <descriptor set>:<binding> pairs.",
             pass_args.c_str());
      return false;
    }
  } else if (pass_name == "struct-packing") {
    if (pass_args.size() == 0) {
      Error(consumer(), nullptr, {},
            "--struct-packing requires a name:rule argument.");
      return false;
    }

    auto separator_pos = pass_args.find(':');
    if (separator_pos == std::string::npos || separator_pos == 0 ||
        separator_pos + 1 == pass_args.size()) {
      Errorf(consumer(), nullptr, {},
             "Invalid argument for --struct-packing: %s", pass_args.c_str());
      return false;
    }

    const std::string struct_name = pass_args.substr(0, separator_pos);
    const std::string rule_name = pass_args.substr(separator_pos + 1);

    RegisterPass(
        CreateStructPackingPass(struct_name.c_str(), rule_name.c_str()));
  } else if (pass_name == "switch-descriptorset") {
    if (pass_args.size() == 0) {
      Error(consumer(), nullptr, {},
            "--switch-descriptorset requires a from:to argument.");
      return false;
    }
    uint32_t from_set = 0, to_set = 0;
    const char* start = pass_args.data();
    const char* end = pass_args.data() + pass_args.size();

    auto result = std::from_chars(start, end, from_set);
    if (result.ec != std::errc()) {
      Errorf(consumer(), nullptr, {},
             "Invalid argument for --switch-descriptorset: %s",
             pass_args.c_str());
      return false;
    }
    start = result.ptr;
    if (start[0] != ':') {
      Errorf(consumer(), nullptr, {},
             "Invalid argument for --switch-descriptorset: %s",
             pass_args.c_str());
      return false;
    }
    start++;
    result = std::from_chars(start, end, to_set);
    if (result.ec != std::errc() || result.ptr != end) {
      Errorf(consumer(), nullptr, {},
             "Invalid argument for --switch-descriptorset: %s",
             pass_args.c_str());
      return false;
    }
    RegisterPass(CreateSwitchDescriptorSetPass(from_set, to_set));
  } else if (pass_name == "modify-maximal-reconvergence") {
    if (pass_args.size() == 0) {
      Error(consumer(), nullptr, {},
            "--modify-maximal-reconvergence requires an argument");
      return false;
    }
    if (pass_args == "add") {
      RegisterPass(CreateModifyMaximalReconvergencePass(true));
    } else if (pass_args == "remove") {
      RegisterPass(CreateModifyMaximalReconvergencePass(false));
    } else {
      Errorf(consumer(), nullptr, {},
             "Invalid argument for --modify-maximal-reconvergence: %s (must be "
             "'add' or 'remove')",
             pass_args.c_str());
      return false;
    }
  } else if (pass_name == "trim-capabilities") {
    RegisterPass(CreateTrimCapabilitiesPass());
  } else {
    Errorf(consumer(), nullptr, {},
           "Unknown flag '--%s'. Use --help for a list of valid flags",
           pass_name.c_str());
    return false;
  }

  return true;
}